

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__stencil_target
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  ulong in_RAX;
  uint64 *puVar2;
  StringHash SVar3;
  uint64 uVar4;
  undefined4 uVar5;
  uint *puVar6;
  ulong uVar7;
  xmlChar **ppxVar8;
  bool bVar9;
  bool failed;
  bool failed_3;
  bool failed_2;
  bool failed_1;
  undefined8 uStack_38;
  
  puVar2 = (uint64 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *attributeDataPtr = puVar2;
  ppxVar8 = attributes->attributes;
  bVar9 = true;
  if (ppxVar8 != (xmlChar **)0x0) {
    uStack_38 = in_RAX;
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        if (0x704ac7 < (long)SVar3) {
          if (SVar3 == 0x7a2f95) {
            uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 5));
            puVar2[3] = uVar4;
            if (uStack_38._5_1_ == '\x01') {
              SVar3 = 0x7a2f95;
              goto LAB_00730a7c;
            }
          }
          else {
            if (SVar3 != 0x704ac8) goto LAB_00730a0b;
            uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 7));
            *puVar2 = uVar4;
            if (uStack_38._7_1_ == '\x01') {
              SVar3 = 0x704ac8;
              goto LAB_00730a7c;
            }
          }
          goto LAB_00730a99;
        }
        if (SVar3 == 0x7400) {
          uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 6));
          puVar2[1] = uVar4;
          if (uStack_38._6_1_ == '\x01') {
            SVar3 = 0x7400;
LAB_00730a7c:
            bVar9 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xc6c1404,SVar3,buffer);
            if (!bVar1) goto LAB_00730a99;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_00730a99:
            validationDataPtr = (void **)0x4;
            bVar9 = true;
          }
          if (!bVar9) goto LAB_00730aa8;
        }
        else {
          if (SVar3 == 0x6c795) {
            SVar3 = GeneratedSaxParser::Utils::calculateStringHash
                              (buffer,(bool *)((long)&uStack_38 + 4));
            bVar9 = false;
            uVar7 = 0;
            puVar6 = &DAT_0085afc8;
            do {
              if (*(StringHash *)(puVar6 + -2) == SVar3) {
                uStack_38 = uStack_38 & 0xffffff0000000000;
                validationDataPtr = (void **)(ulong)*puVar6;
              }
              uVar5 = SUB84(validationDataPtr,0);
              if (*(StringHash *)(puVar6 + -2) == SVar3) break;
              bVar9 = 4 < uVar7;
              uVar7 = uVar7 + 1;
              puVar6 = puVar6 + 4;
            } while (uVar7 != 6);
            if (bVar9) {
              uStack_38 = CONCAT35(uStack_38._5_3_,0x100000000);
              uVar5 = 6;
            }
            *(undefined4 *)(puVar2 + 2) = uVar5;
            if (uStack_38._4_1_ == '\x01') {
              SVar3 = 0x6c795;
              goto LAB_00730a7c;
            }
            goto LAB_00730a99;
          }
LAB_00730a0b:
          bVar9 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xc6c1404,text,buffer);
          validationDataPtr = (void **)0x1;
          if (bVar9) goto LAB_00730aa8;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_00730aa8:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr == 3) {
      bVar9 = true;
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__stencil_target( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__stencil_target( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

stencil_target__AttributeData* attributeData = newData<stencil_target__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_INDEX:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_INDEX,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_MIP:
    {
bool failed;
attributeData->mip = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_MIP,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_FACE:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__image_face_enum, StringHash, ENUM__image_face_enum__COUNT>(attributeValue, failed, ENUM__image_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_FACE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_SLICE:
    {
bool failed;
attributeData->slice = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_SLICE,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_STENCIL_TARGET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}